

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBZR.cxx
# Opt level: O0

void __thiscall
cmCTestBZR::StatusParser::StatusParser(StatusParser *this,cmCTestBZR *bzr,char *prefix)

{
  char *prefix_local;
  cmCTestBZR *bzr_local;
  StatusParser *this_local;
  
  cmProcessTools::LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__StatusParser_0166fdc8;
  this->BZR = bzr;
  cmsys::RegularExpression::RegularExpression(&this->RegexStatus);
  cmProcessTools::LineParser::SetLog
            (&this->super_LineParser,(bzr->super_cmCTestGlobalVC).super_cmCTestVC.Log,prefix);
  cmsys::RegularExpression::compile(&this->RegexStatus,"^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  return;
}

Assistant:

StatusParser(cmCTestBZR* bzr, const char* prefix)
    : BZR(bzr)
  {
    this->SetLog(&bzr->Log, prefix);
    this->RegexStatus.compile("^([-+R?XCP ])([NDKM ])([* ]) +(.+)$");
  }